

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigHash(octet *hash,size_t hash_len,char *name,size_t drop,octet *certs,size_t certs_len,
                octet *date)

{
  bool_t bVar1;
  char *name_00;
  blob_t pvVar2;
  file_t buf_00;
  size_t sVar3;
  file_t hash_00;
  file_t pFVar4;
  ulong in_RCX;
  ulong in_RSI;
  size_t count;
  size_t size;
  file_t file;
  void *state;
  octet *buf;
  octet *stack;
  err_t code;
  size_t buf_size;
  char *in_stack_ffffffffffffff78;
  file_t in_stack_ffffffffffffff88;
  err_t local_44;
  err_t local_4;
  
  if (in_RSI < 0x21) {
    name_00 = (char *)beltHash_keep();
  }
  else {
    name_00 = (char *)bashHash_keep();
  }
  pvVar2 = blobCreate((size_t)in_stack_ffffffffffffff78);
  local_4 = 0x6e;
  if (pvVar2 != (blob_t)0x0) {
    local_4 = 0;
  }
  if (local_4 == 0) {
    if (in_RSI < 0x21) {
      beltHashStart(name_00);
    }
    else {
      bashHashStart(name_00,(size_t)in_stack_ffffffffffffff78);
    }
    buf_00 = fileOpen(name_00,in_stack_ffffffffffffff78);
    local_44 = 0xcb;
    if (buf_00 != (file_t)0x0) {
      local_44 = 0;
    }
    if (local_44 == 0) {
      sVar3 = fileSize(in_stack_ffffffffffffff88);
      if (sVar3 == 0xffffffffffffffff) {
        local_44 = 0xcf;
      }
      else if (sVar3 < in_RCX) {
        local_44 = 0x132;
      }
      if (local_44 == 0) {
        for (hash_00 = (file_t)(sVar3 - in_RCX); hash_00 != (file_t)0x0;
            hash_00 = (file_t)((long)hash_00 - (long)in_stack_ffffffffffffff88)) {
          in_stack_ffffffffffffff88 = hash_00;
          if ((file_t)0xfff < hash_00) {
            in_stack_ffffffffffffff88 = (file_t)&DAT_00001000;
          }
          pFVar4 = (file_t)fileRead2(buf_00,(size_t)hash_00,in_stack_ffffffffffffff88);
          if (pFVar4 != in_stack_ffffffffffffff88) {
            local_44 = 0xcf;
          }
          if (local_44 != 0) {
            fileClose((file_t)0x1098e5);
            blobClose((blob_t)0x1098ef);
            return local_44;
          }
          if (in_RSI < 0x21) {
            beltHashStepH(hash_00,(size_t)in_stack_ffffffffffffff88,name_00);
          }
          else {
            bashHashStepH(hash_00,(size_t)in_stack_ffffffffffffff88,name_00);
          }
        }
        bVar1 = fileClose((file_t)0x109952);
        local_4 = 0x67;
        if (bVar1 != 0) {
          local_4 = 0;
        }
        if (local_4 == 0) {
          if (in_RSI < 0x21) {
            beltHashStepH(hash_00,(size_t)in_stack_ffffffffffffff88,name_00);
            beltHashStepH(hash_00,(size_t)in_stack_ffffffffffffff88,name_00);
            beltHashStepG2((octet *)hash_00,(size_t)in_stack_ffffffffffffff88,name_00);
          }
          else {
            bashHashStepH(hash_00,(size_t)in_stack_ffffffffffffff88,name_00);
            bashHashStepH(hash_00,(size_t)in_stack_ffffffffffffff88,name_00);
            bashHashStepG((octet *)hash_00,(size_t)in_stack_ffffffffffffff88,name_00);
          }
          blobClose((blob_t)0x109a18);
        }
        else {
          blobClose((blob_t)0x109976);
        }
      }
      else {
        fileClose((file_t)0x10984f);
        blobClose((blob_t)0x109859);
        local_4 = local_44;
      }
    }
    else {
      blobClose((blob_t)0x1097f7);
      local_4 = local_44;
    }
  }
  return local_4;
}

Assistant:

static err_t cmdSigHash(octet hash[], size_t hash_len, const char* name,
	size_t drop, const octet certs[], size_t certs_len, const octet date[6])
{
	const size_t buf_size = 4096;
	err_t code;
	octet* stack;
	octet* buf;
	void* state;
	file_t file;
	size_t size;
	// pre
	ASSERT(hash_len == 24 || hash_len == 32 || hash_len == 48 ||
		hash_len == 64);
	ASSERT(memIsValid(hash, hash_len));
	ASSERT(strIsValid(name));
	// выделить и разметить память
	code = cmdBlobCreate(stack, buf_size +
		(hash_len <= 32 ? beltHash_keep() : bashHash_keep()));
	ERR_CALL_CHECK(code);
	buf = (octet*)stack;
	state = buf + buf_size;
	// начать хэширование
	if (hash_len <= 32)
		beltHashStart(state);
	else
		bashHashStart(state, hash_len * 4);
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить размер файла
	size = fileSize(file);
	if (size == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (size < drop)
		code = ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
	// хэшировать файл
	for (size -= drop; size;)
	{
		size_t count = MIN2(size, buf_size);
		if (fileRead2(buf, count, file) != count)
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		if (hash_len <= 32)
			beltHashStepH(stack, count, state);
		else
			bashHashStepH(stack, count, state);
		size -= count;
	}
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать сертификаты и дату
	if (hash_len <= 32)
	{
		beltHashStepH(certs, certs_len, state);
		beltHashStepH(date, 6, state);
		beltHashStepG2(hash, hash_len, state);
	}
	else
	{
		bashHashStepH(certs, certs_len, state);
		bashHashStepH(date, 6, state);
		bashHashStepG(hash, hash_len, state);
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}